

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterFederate.cpp
# Opt level: O2

void __thiscall
helics::FilterFederate::generateProcessMarker
          (FilterFederate *this,GlobalFederateId fid,uint32_t pid,Time returnTime)

{
  mapped_type *pmVar1;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *this_00;
  BaseType fid_index;
  ActionMessage block;
  
  fid_index = fid.gid;
  pmVar1 = std::
           map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
           ::operator[](&this->ongoingFilterProcesses,&fid_index);
  if ((pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
    ActionMessage::ActionMessage(&block,cmd_time_block);
    block.dest_id.gid = (this->mCoreID).gid;
    block.source_id.gid = fid.gid;
    std::function<void_(const_helics::ActionMessage_&)>::operator()(&this->mSendMessage,&block);
    ActionMessage::~ActionMessage(&block);
  }
  this_00 = &std::
             map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
             ::operator[](&this->ongoingFilterProcesses,&fid_index)->_M_t;
  block.messageAction = pid;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(this_00,&block.messageAction);
  addTimeReturn(this,pid,returnTime);
  return;
}

Assistant:

void FilterFederate::generateProcessMarker(GlobalFederateId fid, uint32_t pid, Time returnTime)
{
    // nothing further to process
    auto fid_index = fid.baseValue();
    if (ongoingFilterProcesses[fid_index].empty()) {
        ActionMessage block(CMD_TIME_BLOCK);
        block.dest_id = mCoreID;
        block.source_id = fid;
        mSendMessage(block);
    }
    ongoingFilterProcesses[fid_index].insert(pid);
    addTimeReturn(pid, returnTime);
}